

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DockNodeTreeMerge
               (ImGuiContext *ctx,ImGuiDockNode *parent_node,ImGuiDockNode *merge_lead_child)

{
  ImGuiDockNode *src_node;
  ImGuiDockNode *src_node_00;
  ImVec2 IVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  
  src_node = parent_node->ChildNodes[0];
  src_node_00 = parent_node->ChildNodes[1];
  if (src_node == (ImGuiDockNode *)0x0 && src_node_00 == (ImGuiDockNode *)0x0) {
    __assert_fail("child_0 || child_1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                  ,0x3e32,
                  "void ImGui::DockNodeTreeMerge(ImGuiContext *, ImGuiDockNode *, ImGuiDockNode *)")
    ;
  }
  if (src_node_00 != merge_lead_child && src_node != merge_lead_child) {
    __assert_fail("merge_lead_child == child_0 || merge_lead_child == child_1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                  ,0x3e33,
                  "void ImGui::DockNodeTreeMerge(ImGuiContext *, ImGuiDockNode *, ImGuiDockNode *)")
    ;
  }
  if (((src_node != (ImGuiDockNode *)0x0) && (0 < (src_node->Windows).Size)) ||
     ((src_node_00 != (ImGuiDockNode *)0x0 && (0 < (src_node_00->Windows).Size)))) {
    if (parent_node->TabBar != (ImGuiTabBar *)0x0) {
      __assert_fail("parent_node->TabBar == __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                    ,0x3e36,
                    "void ImGui::DockNodeTreeMerge(ImGuiContext *, ImGuiDockNode *, ImGuiDockNode *)"
                   );
    }
    if ((parent_node->Windows).Size != 0) {
      __assert_fail("parent_node->Windows.Size == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                    ,0x3e37,
                    "void ImGui::DockNodeTreeMerge(ImGuiContext *, ImGuiDockNode *, ImGuiDockNode *)"
                   );
    }
  }
  IVar1 = parent_node->SizeRef;
  DockNodeMoveChildNodes(parent_node,merge_lead_child);
  if (src_node != (ImGuiDockNode *)0x0) {
    DockNodeMoveWindows(parent_node,src_node);
    DockSettingsRenameNodeReferences(src_node->ID,parent_node->ID);
  }
  if (src_node_00 != (ImGuiDockNode *)0x0) {
    DockNodeMoveWindows(parent_node,src_node_00);
    DockSettingsRenameNodeReferences(src_node_00->ID,parent_node->ID);
  }
  if (0 < (parent_node->Windows).Size) {
    lVar5 = 0;
    do {
      SetWindowPos((parent_node->Windows).Data[lVar5],&parent_node->Pos,1);
      if ((parent_node->Windows).Size <= lVar5) {
        __assert_fail("i >= 0 && i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.h"
                      ,0x74f,"T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]");
      }
      SetWindowSize((parent_node->Windows).Data[lVar5],&parent_node->Size,1);
      lVar5 = lVar5 + 1;
    } while (lVar5 < (parent_node->Windows).Size);
  }
  *(ushort *)&parent_node->field_0xc4 = *(ushort *)&parent_node->field_0xc4 & 0xfe00;
  uVar4 = parent_node->LocalFlags & 0xff3e078f;
  uVar2 = 0;
  parent_node->VisibleWindow = merge_lead_child->VisibleWindow;
  parent_node->SizeRef = IVar1;
  parent_node->LocalFlags = uVar4;
  uVar3 = 0;
  if (src_node != (ImGuiDockNode *)0x0) {
    uVar3 = src_node->LocalFlags & 0xc1f870;
  }
  uVar3 = uVar3 | uVar4;
  parent_node->LocalFlags = uVar3;
  if (src_node_00 != (ImGuiDockNode *)0x0) {
    uVar2 = src_node_00->LocalFlags & 0xc1f870;
  }
  uVar2 = uVar2 | uVar3;
  uVar4 = 0;
  parent_node->LocalFlags = uVar2;
  uVar3 = 0;
  if (src_node != (ImGuiDockNode *)0x0) {
    uVar3 = src_node->LocalFlagsInWindows;
  }
  if (src_node_00 != (ImGuiDockNode *)0x0) {
    uVar4 = src_node_00->LocalFlagsInWindows;
  }
  parent_node->LocalFlagsInWindows = uVar4 | uVar3;
  parent_node->MergedFlags = uVar2 | parent_node->SharedFlags | uVar4 | uVar3;
  if (src_node != (ImGuiDockNode *)0x0) {
    ImGuiStorage::SetVoidPtr(&(ctx->DockContext).Nodes,src_node->ID,(void *)0x0);
    IM_DELETE<ImGuiDockNode>(src_node);
  }
  if (src_node_00 != (ImGuiDockNode *)0x0) {
    ImGuiStorage::SetVoidPtr(&(ctx->DockContext).Nodes,src_node_00->ID,(void *)0x0);
    IM_DELETE<ImGuiDockNode>(src_node_00);
    return;
  }
  return;
}

Assistant:

void ImGui::DockNodeTreeMerge(ImGuiContext* ctx, ImGuiDockNode* parent_node, ImGuiDockNode* merge_lead_child)
{
    // When called from DockContextProcessUndockNode() it is possible that one of the child is NULL.
    ImGuiDockNode* child_0 = parent_node->ChildNodes[0];
    ImGuiDockNode* child_1 = parent_node->ChildNodes[1];
    IM_ASSERT(child_0 || child_1);
    IM_ASSERT(merge_lead_child == child_0 || merge_lead_child == child_1);
    if ((child_0 && child_0->Windows.Size > 0) || (child_1 && child_1->Windows.Size > 0))
    {
        IM_ASSERT(parent_node->TabBar == NULL);
        IM_ASSERT(parent_node->Windows.Size == 0);
    }
    IMGUI_DEBUG_LOG_DOCKING("DockNodeTreeMerge 0x%08X & 0x%08X back into parent 0x%08X\n", child_0 ? child_0->ID : 0, child_1 ? child_1->ID : 0, parent_node->ID);

    ImVec2 backup_last_explicit_size = parent_node->SizeRef;
    DockNodeMoveChildNodes(parent_node, merge_lead_child);
    if (child_0)
    {
        DockNodeMoveWindows(parent_node, child_0); // Generally only 1 of the 2 child node will have windows
        DockSettingsRenameNodeReferences(child_0->ID, parent_node->ID);
    }
    if (child_1)
    {
        DockNodeMoveWindows(parent_node, child_1);
        DockSettingsRenameNodeReferences(child_1->ID, parent_node->ID);
    }
    DockNodeApplyPosSizeToWindows(parent_node);
    parent_node->AuthorityForPos = parent_node->AuthorityForSize = parent_node->AuthorityForViewport = ImGuiDataAuthority_Auto;
    parent_node->VisibleWindow = merge_lead_child->VisibleWindow;
    parent_node->SizeRef = backup_last_explicit_size;

    // Flags transfer
    parent_node->LocalFlags &= ~ImGuiDockNodeFlags_LocalFlagsTransferMask_; // Preserve Dockspace flag
    parent_node->LocalFlags |= (child_0 ? child_0->LocalFlags : 0) & ImGuiDockNodeFlags_LocalFlagsTransferMask_;
    parent_node->LocalFlags |= (child_1 ? child_1->LocalFlags : 0) & ImGuiDockNodeFlags_LocalFlagsTransferMask_;
    parent_node->LocalFlagsInWindows = (child_0 ? child_0->LocalFlagsInWindows : 0) | (child_1 ? child_1->LocalFlagsInWindows : 0); // FIXME: Would be more consistent to update from actual windows
    parent_node->UpdateMergedFlags();

    if (child_0)
    {
        ctx->DockContext.Nodes.SetVoidPtr(child_0->ID, NULL);
        IM_DELETE(child_0);
    }
    if (child_1)
    {
        ctx->DockContext.Nodes.SetVoidPtr(child_1->ID, NULL);
        IM_DELETE(child_1);
    }
}